

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O3

int CVodeSetMaxNumProjFails(void *cvode_mem,int max_fails)

{
  int iVar1;
  int iVar2;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  CVodeProjMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvAccessProjMem(cvode_mem,"CVodeSetMaxNumProjFails",&local_10,&local_18);
  if (iVar1 == 0) {
    iVar2 = 10;
    if (0 < max_fails) {
      iVar2 = max_fails;
    }
    local_18->max_fails = iVar2;
  }
  return iVar1;
}

Assistant:

int CVodeSetMaxNumProjFails(void *cvode_mem, int max_fails)
{
  int          retval;
  CVodeMem     cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, "CVodeSetMaxNumProjFails",
                           &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) return(retval);

  /* Set maximum number of projection failures in a step attempt */
  if (max_fails < 1)
  {
    /* Restore default */
    proj_mem->max_fails = PROJ_MAX_FAILS;
  }
  else
  {
    /* Update max number of fails */
    proj_mem->max_fails = max_fails;
  }

  return(CV_SUCCESS);
}